

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O1

void __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::before_value(basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
               *this,uint8_t code)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer *ppuVar1;
  pointer psVar2;
  iterator __position;
  ulong __val;
  bool bVar3;
  char cVar4;
  assertion_error *this_01;
  ulong uVar5;
  char cVar6;
  string name;
  uint8_t local_4a;
  uchar local_49;
  string local_48;
  
  psVar2 = (this->stack_).
           super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_4a = code;
  if ((this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start == psVar2) {
    this_01 = (assertion_error *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"assertion \'!stack_.empty()\' failed at  <> :0","");
    assertion_error::assertion_error(this_01,&local_48);
    __cxa_throw(this_01,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = &this->buffer_;
  if (psVar2[-1].type_ == document) {
    (this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[psVar2[-1].name_offset_] = code;
  }
  else {
    __position._M_current =
         (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,__position,&local_4a
                );
    }
    else {
      *__position._M_current = code;
      ppuVar1 = &(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    psVar2 = (this->stack_).
             super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>::stack_item>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __val = psVar2[-1].index_;
    psVar2[-1].index_ = __val + 1;
    cVar6 = '\x01';
    if (9 < __val) {
      uVar5 = __val;
      cVar4 = '\x04';
      do {
        cVar6 = cVar4;
        if (uVar5 < 100) {
          cVar6 = cVar6 + -2;
          goto LAB_00206ef2;
        }
        if (uVar5 < 1000) {
          cVar6 = cVar6 + -1;
          goto LAB_00206ef2;
        }
        if (uVar5 < 10000) goto LAB_00206ef2;
        bVar3 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        cVar4 = cVar6 + '\x04';
      } while (bVar3);
      cVar6 = cVar6 + '\x01';
    }
LAB_00206ef2:
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_48,cVar6);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_48._M_dataplus._M_p,(uint)local_48._M_string_length,__val);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)this_00,
               (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p +
               CONCAT44(local_48._M_string_length._4_4_,(uint)local_48._M_string_length));
    local_49 = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (this_00,&local_49);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void before_value(uint8_t code) 
    {
        JSONCONS_ASSERT(!stack_.empty());
        if (stack_.back().is_object())
        {
            buffer_[stack_.back().member_offset()] = code;
        }
        else
        {
            buffer_.push_back(code);
            std::string name = std::to_string(stack_.back().next_index());
            buffer_.insert(buffer_.end(), name.begin(), name.end());
            buffer_.push_back(0x00);
        }
    }